

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O0

void __thiscall GrcSymbolTable::InitGlyphMetrics(GrcSymbolTable *this)

{
  Symbol this_00;
  Symbol pGVar1;
  Symbol this_01;
  Symbol psym;
  SymbolType kst;
  string *in_stack_fffffffffffffab8;
  allocator *paVar2;
  string *in_stack_fffffffffffffac0;
  string *in_stack_fffffffffffffac8;
  GrcStructName *in_stack_fffffffffffffad0;
  undefined8 in_stack_fffffffffffffaf8;
  OpPrec OVar3;
  undefined8 in_stack_fffffffffffffb00;
  GrcStructName *in_stack_fffffffffffffb08;
  allocator *xns;
  GrcSymbolTable *in_stack_fffffffffffffb10;
  allocator local_451;
  string local_450 [63];
  allocator local_411;
  string local_410 [63];
  allocator local_3d1;
  string local_3d0 [63];
  allocator local_391;
  string local_390 [63];
  allocator local_351;
  string local_350 [63];
  allocator local_311;
  string local_310 [63];
  allocator local_2d1;
  string local_2d0 [63];
  allocator local_291;
  string local_290 [39];
  allocator local_269;
  string local_268 [63];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [63];
  allocator local_1c1;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [63];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [63];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [63];
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [56];
  Symbol local_18;
  undefined4 local_c;
  
  OVar3 = (OpPrec)((ulong)in_stack_fffffffffffffaf8 >> 0x20);
  local_c = 0xc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"boundingbox",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"top",&local_89);
  GrcStructName::GrcStructName
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  local_18 = PreDefineSymbol(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                             (SymbolType)((ulong)in_stack_fffffffffffffb00 >> 0x20),
                             (ExpressionType)in_stack_fffffffffffffb00,OVar3);
  GrcStructName::~GrcStructName((GrcStructName *)0x1cbf7d);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_18->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"boundingbox",&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"bottom",&local_f1);
  GrcStructName::GrcStructName
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  local_18 = PreDefineSymbol(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                             (SymbolType)((ulong)in_stack_fffffffffffffb00 >> 0x20),
                             (ExpressionType)in_stack_fffffffffffffb00,OVar3);
  GrcStructName::~GrcStructName((GrcStructName *)0x1cc093);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  local_18->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"boundingbox",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"left",&local_159);
  GrcStructName::GrcStructName
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  local_18 = PreDefineSymbol(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                             (SymbolType)((ulong)in_stack_fffffffffffffb00 >> 0x20),
                             (ExpressionType)in_stack_fffffffffffffb00,OVar3);
  GrcStructName::~GrcStructName((GrcStructName *)0x1cc1a9);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  local_18->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"boundingbox",&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,"right",&local_1c1);
  GrcStructName::GrcStructName
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  local_18 = PreDefineSymbol(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                             (SymbolType)((ulong)in_stack_fffffffffffffb00 >> 0x20),
                             (ExpressionType)in_stack_fffffffffffffb00,OVar3);
  GrcStructName::~GrcStructName((GrcStructName *)0x1cc2bf);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  local_18->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"boundingbox",&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"height",&local_229);
  GrcStructName::GrcStructName
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  local_18 = PreDefineSymbol(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                             (SymbolType)((ulong)in_stack_fffffffffffffb00 >> 0x20),
                             (ExpressionType)in_stack_fffffffffffffb00,OVar3);
  GrcStructName::~GrcStructName((GrcStructName *)0x1cc3d5);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  local_18->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,"boundingbox",&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,"width",&local_291);
  GrcStructName::GrcStructName
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  this_00 = PreDefineSymbol(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                            (SymbolType)((ulong)in_stack_fffffffffffffb00 >> 0x20),
                            (ExpressionType)in_stack_fffffffffffffb00,OVar3);
  local_18 = this_00;
  GrcStructName::~GrcStructName((GrcStructName *)0x1cc4e5);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  local_18->m_fGeneric = true;
  xns = &local_2d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"advanceheight",xns);
  GrcStructName::GrcStructName((GrcStructName *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8)
  ;
  pGVar1 = PreDefineSymbol((GrcSymbolTable *)this_00,(GrcStructName *)xns,
                           (SymbolType)((ulong)in_stack_fffffffffffffb00 >> 0x20),
                           (ExpressionType)in_stack_fffffffffffffb00,OVar3);
  local_18 = pGVar1;
  GrcStructName::~GrcStructName((GrcStructName *)0x1cc5b4);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  local_18->m_fGeneric = true;
  paVar2 = &local_311;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,"advancewidth",paVar2);
  OVar3 = (OpPrec)((ulong)paVar2 >> 0x20);
  GrcStructName::GrcStructName((GrcStructName *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8)
  ;
  local_18 = PreDefineSymbol((GrcSymbolTable *)this_00,(GrcStructName *)xns,
                             (SymbolType)((ulong)pGVar1 >> 0x20),(ExpressionType)pGVar1,OVar3);
  GrcStructName::~GrcStructName((GrcStructName *)0x1cc669);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  local_18->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_350,"leftsidebearing",&local_351);
  GrcStructName::GrcStructName((GrcStructName *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8)
  ;
  local_18 = PreDefineSymbol((GrcSymbolTable *)this_00,(GrcStructName *)xns,
                             (SymbolType)((ulong)pGVar1 >> 0x20),(ExpressionType)pGVar1,OVar3);
  GrcStructName::~GrcStructName((GrcStructName *)0x1cc71e);
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  local_18->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"rightsidebearing",&local_391);
  GrcStructName::GrcStructName((GrcStructName *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8)
  ;
  local_18 = PreDefineSymbol((GrcSymbolTable *)this_00,(GrcStructName *)xns,
                             (SymbolType)((ulong)pGVar1 >> 0x20),(ExpressionType)pGVar1,OVar3);
  GrcStructName::~GrcStructName((GrcStructName *)0x1cc7d3);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  local_18->m_fGeneric = true;
  paVar2 = &local_3d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d0,"ascent",paVar2);
  GrcStructName::GrcStructName((GrcStructName *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8)
  ;
  this_01 = PreDefineSymbol((GrcSymbolTable *)this_00,(GrcStructName *)xns,
                            (SymbolType)((ulong)pGVar1 >> 0x20),(ExpressionType)pGVar1,OVar3);
  local_18 = this_01;
  GrcStructName::~GrcStructName((GrcStructName *)0x1cc888);
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  local_18->m_fGeneric = true;
  paVar2 = &local_411;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_410,"descent",paVar2);
  GrcStructName::GrcStructName((GrcStructName *)this_01,(string *)paVar2);
  local_18 = PreDefineSymbol((GrcSymbolTable *)this_00,(GrcStructName *)xns,
                             (SymbolType)((ulong)pGVar1 >> 0x20),(ExpressionType)pGVar1,OVar3);
  GrcStructName::~GrcStructName((GrcStructName *)0x1cc93d);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  local_18->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_450,"munits",&local_451);
  GrcStructName::GrcStructName((GrcStructName *)this_01,(string *)paVar2);
  local_18 = PreDefineSymbol((GrcSymbolTable *)this_00,(GrcStructName *)xns,
                             (SymbolType)((ulong)pGVar1 >> 0x20),(ExpressionType)pGVar1,OVar3);
  GrcStructName::~GrcStructName((GrcStructName *)0x1cc9f2);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  local_18->m_fGeneric = true;
  return;
}

Assistant:

void GrcSymbolTable::InitGlyphMetrics()
{
	SymbolType kst = ksymtGlyphMetric;

	Symbol psym;
	psym = PreDefineSymbol(GrcStructName("boundingbox", "top"),	kst, kexptMeas);
	psym->m_fGeneric = true;
	psym = PreDefineSymbol(GrcStructName("boundingbox", "bottom"),	kst, kexptMeas);
	psym->m_fGeneric = true;
	psym = PreDefineSymbol(GrcStructName("boundingbox", "left"),	kst, kexptMeas);
	psym->m_fGeneric = true;
	psym = PreDefineSymbol(GrcStructName("boundingbox", "right"),	kst, kexptMeas);
	psym->m_fGeneric = true;
	psym = PreDefineSymbol(GrcStructName("boundingbox", "height"),	kst, kexptMeas);
	psym->m_fGeneric = true;
	psym = PreDefineSymbol(GrcStructName("boundingbox", "width"),	kst, kexptMeas);
	psym->m_fGeneric = true;

	psym = PreDefineSymbol(GrcStructName("advanceheight"),		kst, kexptMeas);
	psym->m_fGeneric = true;
	psym = PreDefineSymbol(GrcStructName("advancewidth"),		kst, kexptMeas);
	psym->m_fGeneric = true;

	psym = PreDefineSymbol(GrcStructName("leftsidebearing"),	kst, kexptMeas);
	psym->m_fGeneric = true;
	psym = PreDefineSymbol(GrcStructName("rightsidebearing"),	kst, kexptMeas);	// = munits - lsb
	psym->m_fGeneric = true;

	psym = PreDefineSymbol(GrcStructName("ascent"),	kst, kexptMeas);
	psym->m_fGeneric = true;
	psym = PreDefineSymbol(GrcStructName("descent"),	kst, kexptMeas);	// = font height - ascent
	psym->m_fGeneric = true;
	psym = PreDefineSymbol(GrcStructName("munits"),	kst, kexptNumber);
	psym->m_fGeneric = true;
}